

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readmod.c
# Opt level: O0

int it_mod_read_sample_data(IT_SAMPLE *sample,DUMBFILE *f,uint32 fft)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int32 iVar4;
  void *pvVar5;
  int32 in_EDX;
  DUMBFILE *in_RSI;
  long in_RDI;
  DUMBFILE *unaff_retaddr;
  IT_SAMPLE *in_stack_00000008;
  int delta;
  int feh;
  int32 truncated_size;
  int32 i;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  int local_20;
  
  if (((*(byte *)(in_RDI + 0x32) & 0x10) == 0) ||
     (*(int *)(in_RDI + 0x38) <= *(int *)(in_RDI + 0x40))) {
    iVar2 = 0;
  }
  else {
    iVar2 = *(int *)(in_RDI + 0x38) - *(int *)(in_RDI + 0x40);
    *(undefined4 *)(in_RDI + 0x38) = *(undefined4 *)(in_RDI + 0x40);
  }
  if (*(int *)(in_RDI + 0x38) != 0) {
    pvVar5 = malloc((long)*(int *)(in_RDI + 0x38));
    *(void **)(in_RDI + 0x58) = pvVar5;
    if (*(long *)(in_RDI + 0x58) == 0) {
      return -1;
    }
    if (*(int *)(in_RDI + 0x38) < 5) {
      local_20 = dumbfile_getnc((char *)in_RSI,in_EDX,
                                (DUMBFILE *)CONCAT44(iVar2,in_stack_ffffffffffffffd8));
    }
    else {
      local_20 = dumbfile_getnc((char *)in_RSI,in_EDX,
                                (DUMBFILE *)CONCAT44(iVar2,in_stack_ffffffffffffffd8));
      if (local_20 == 5) {
        iVar3 = memcmp(*(void **)(in_RDI + 0x58),"ADPCM",5);
        if (iVar3 == 0) {
          iVar4 = _dumb_it_read_sample_data_adpcm4(in_stack_00000008,unaff_retaddr);
          if (iVar4 < 0) {
            return -1;
          }
          return 0;
        }
        iVar4 = dumbfile_getnc((char *)in_RSI,in_EDX,
                               (DUMBFILE *)CONCAT44(iVar2,in_stack_ffffffffffffffd8));
        local_20 = iVar4 + 5;
      }
    }
    if (local_20 < *(int *)(in_RDI + 0x38)) {
      if (local_20 < 1) {
        *(undefined1 *)(in_RDI + 0x32) = 0;
        return 0;
      }
      *(int *)(in_RDI + 0x38) = local_20;
      if (local_20 < *(int *)(in_RDI + 0x40)) {
        *(int *)(in_RDI + 0x40) = local_20;
      }
      if (local_20 < *(int *)(in_RDI + 0x3c)) {
        *(byte *)(in_RDI + 0x32) = *(byte *)(in_RDI + 0x32) & 0xef;
      }
    }
    else {
      iVar3 = dumbfile_error(in_RSI);
      if (iVar2 != 0) {
        dumbfile_skip((DUMBFILE *)CONCAT44(iVar2,iVar3),
                      CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      }
      if (iVar3 != 0) {
        return -1;
      }
    }
    if ((in_EDX == 0x4d000000) || (in_EDX == 0x38000000)) {
      cVar1 = '\0';
      for (local_20 = 0; local_20 < *(int *)(in_RDI + 0x38); local_20 = local_20 + 1) {
        cVar1 = *(char *)(*(long *)(in_RDI + 0x58) + (long)local_20) + cVar1;
        *(char *)(*(long *)(in_RDI + 0x58) + (long)local_20) = cVar1;
      }
    }
  }
  return 0;
}

Assistant:

static int it_mod_read_sample_data(IT_SAMPLE *sample, DUMBFILE *f, uint32 fft)
{
	int32 i;
	int32 truncated_size;

	/* let's get rid of the sample data coming after the end of the loop */
	if ((sample->flags & IT_SAMPLE_LOOP) && sample->loop_end < sample->length) {
		truncated_size = sample->length - sample->loop_end;
		sample->length = sample->loop_end;
	} else {
		truncated_size = 0;
	}

	if (sample->length) {
		sample->data = malloc(sample->length);

		if (!sample->data)
			return -1;

		/* Sample data are stored in "8-bit two's compliment format" (sic). */
		/*
		for (i = 0; i < sample->length; i++)
			((signed char *)sample->left)[i] = dumbfile_getc(f);
		*/
		/* F U Olivier Lapicque */
		if (sample->length >= 5)
		{
			i = dumbfile_getnc(sample->data, 5, f);
			if (i == 5)
			{
				if (!memcmp(sample->data, "ADPCM", 5))
				{
					if (_dumb_it_read_sample_data_adpcm4(sample, f) < 0)
						return -1;

					return 0;
				}
				else
				{
					i += dumbfile_getnc(((char *)sample->data) + 5, sample->length - 5, f);
				}
			}
		}
		else
		{
			i = dumbfile_getnc(sample->data, sample->length, f);
		}
		if (i < sample->length)
		{
			if (i <= 0)
			{
				sample->flags = 0;
				return 0;
			}
			sample->length = i;
			if (sample->loop_end > i) sample->loop_end = i;
			// holy crap!
			if (sample->loop_start > i) sample->flags &= ~IT_SAMPLE_LOOP;
		}
		else
		{
			/* skip truncated data */
			int feh = dumbfile_error(f);

			if (truncated_size) dumbfile_skip(f, truncated_size);
			// Should we be truncating it?

			if (feh)
				return -1;
		}

		if (fft == DUMB_ID('M',0,0,0) || fft == DUMB_ID('8',0,0,0)) {
			int delta = 0;
			for (i = 0; i < sample->length; i++) {
				delta += ((signed char *)sample->data)[i];
				((signed char *)sample->data)[i] = delta;
			}
		}
	}

	return 0;
}